

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_modelWithComponents_Test::TestBody(Clone_modelWithComponents_Test *this)

{
  string *psVar1;
  ModelPtr mClone;
  ComponentPtr c;
  ModelPtr m;
  ComponentPtr c2;
  ComponentPtr c1;
  allocator<char> local_69;
  string local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [3];
  string *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  string *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Model::create();
  psVar1 = local_38;
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"unique_model",(allocator<char> *)&local_48);
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(local_68);
  psVar1 = local_38;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"model",(allocator<char> *)&local_48);
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(local_68);
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  psVar1 = local_48;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"unique",&local_69);
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(local_68);
  psVar1 = local_48;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"copy",&local_69);
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"child_1",&local_69);
  libcellml::NamedEntity::setName(local_18);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"child_2",&local_69);
  libcellml::NamedEntity::setName(local_28);
  std::__cxx11::string::~string(local_68);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_48);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_48);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_38);
  libcellml::Model::clone();
  compareModel((shared_ptr *)&local_38,(shared_ptr *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

TEST(Clone, modelWithComponents)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");

    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();

    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c2->setName("child_2");

    c->addComponent(c1);
    c->addComponent(c2);

    m->addComponent(c);

    auto mClone = m->clone();

    compareModel(m, mClone);
}